

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_resolve_token_dependencies
          (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
           *this,Pipeflow *pf)

{
  ulong *puVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __hash_code __code;
  ulong uVar8;
  __node_base_ptr p_Var9;
  ulong *puVar10;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  __it;
  _Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false> __it_00;
  
  __it._M_cur = (__node_type *)0x0;
  p_Var6 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->_token_dependencies)._M_h,
                      pf->_token % (this->_token_dependencies)._M_h._M_bucket_count,&pf->_token,
                      pf->_token);
  if (p_Var6 != (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    return;
  }
  puVar10 = *(ulong **)((long)__it._M_cur + 0x10);
  puVar1 = *(ulong **)((long)__it._M_cur + 0x18);
  if (puVar10 != puVar1) {
    do {
      p_Var2 = (_Hash_node_base *)*puVar10;
      uVar3 = (this->_deferred_tokens)._M_h._M_bucket_count;
      uVar8 = (ulong)p_Var2 % uVar3;
      p_Var4 = (this->_deferred_tokens)._M_h._M_buckets[uVar8];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var7 = p_Var4, p_Var9 = p_Var4->_M_nxt, p_Var2 != p_Var4->_M_nxt[1]._M_nxt)) {
        while (p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)p_Var5[1]._M_nxt % uVar3 != uVar8) ||
             (p_Var7 = p_Var9, p_Var9 = p_Var5, p_Var2 == p_Var5[1]._M_nxt)) goto LAB_00111fab;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_00111fab:
      if (p_Var7 == (__node_base_ptr)0x0) {
        __it_00._M_cur = (__node_type *)0x0;
      }
      else {
        __it_00._M_cur = (__node_type *)p_Var7->_M_nxt;
      }
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)__it_00._M_cur + 0x20),&pf->_token);
      if (*(long *)((long)__it_00._M_cur + 0x38) == 0) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&this->_ready_tokens,(unsigned_long *)((long)__it_00._M_cur + 0x10),
                   (unsigned_long *)((long)__it_00._M_cur + 0x18));
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->_deferred_tokens)._M_h,(const_iterator)__it_00._M_cur);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->_token_dependencies)._M_h,(const_iterator)__it._M_cur);
  return;
}

Assistant:

void ScalablePipeline<P>::_resolve_token_dependencies(Pipeflow& pf) {

  if (auto it = _token_dependencies.find(pf._token);
      it != _token_dependencies.end()) {
    
    // iterate tokens that defer to pf._token
    for(size_t target : it->second) {

      auto dpf = _deferred_tokens.find(target);

      assert(dpf != _deferred_tokens.end());

      // erase pf._token from target's _dependents
      dpf->second._dependents.erase(pf._token);
      
      // target has no dependents
      if (dpf->second._dependents.empty()) {
        _ready_tokens.emplace(dpf->second._token, dpf->second._num_deferrals);
        _deferred_tokens.erase(dpf);
      }
    }

    _token_dependencies.erase(it);
  }
}